

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

void share_remove_channel(ssh_sharing_connstate *cs,share_channel *chan)

{
  share_channel *chan_local;
  ssh_sharing_connstate *cs_local;
  
  del234(cs->channels_by_us,chan);
  del234(cs->channels_by_server,chan);
  if (chan->x11_auth_upstream != (X11FakeAuth *)0x0) {
    ssh_remove_sharing_x11_display(cs->parent->cl,chan->x11_auth_upstream);
  }
  safefree(chan->x11_auth_data);
  safefree(chan);
  return;
}

Assistant:

static void share_remove_channel(struct ssh_sharing_connstate *cs,
                                 struct share_channel *chan)
{
    del234(cs->channels_by_us, chan);
    del234(cs->channels_by_server, chan);
    if (chan->x11_auth_upstream)
        ssh_remove_sharing_x11_display(cs->parent->cl,
                                       chan->x11_auth_upstream);
    sfree(chan->x11_auth_data);
    sfree(chan);
}